

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O3

int32_t packDiff(int32_t diff)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  short sVar6;
  int iVar7;
  
  if (diff < -0x40) {
    if ((uint)diff < 0xffffd6ef) {
      if (0xfffd22f3 < (uint)diff) {
        uVar3 = (-diff - 0x2911U) % 0xf3;
        uVar1 = 0xf3 - uVar3;
        if (uVar3 == 0) {
          uVar1 = 0;
        }
        uVar3 = (uint)(uVar3 != 0) + (-diff - 0x2911U) / 0xf3;
        if (uVar1 < 0x14) {
          uVar1 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar1];
        }
        else {
          uVar1 = uVar1 + 0xd;
        }
        uVar5 = (uVar3 & 0xffff) * 0xdb3 >> 0x10;
        uVar2 = ((uVar3 - uVar5 & 0xffff) >> 1) + uVar5 >> 7;
        iVar4 = uVar3 + uVar2 * -0xf3;
        uVar3 = -uVar2;
        uVar5 = 0;
        if ((short)iVar4 != 0) {
          uVar5 = 0xf3 - iVar4;
          uVar3 = ~uVar2;
        }
        if ((ushort)uVar5 < 0x14) {
          uVar5 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar5 & 0xffff];
        }
        else {
          uVar5 = uVar5 + 0xd & 0xffff;
        }
        return uVar3 * 0x10000 + 0x250000 | uVar1 | uVar5 << 8 | 0x3000000;
      }
      uVar3 = (-diff - 0x2dd0cU) % 0xf3;
      uVar1 = 0xf3 - uVar3;
      if (uVar3 == 0) {
        uVar1 = 0;
      }
      uVar3 = (uint)(uVar3 != 0) + (-diff - 0x2dd0cU) / 0xf3;
      if (uVar1 < 0x14) {
        uVar1 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar1];
      }
      else {
        uVar1 = uVar1 + 0xd;
      }
      uVar2 = 0xf3 - uVar3 % 0xf3;
      uVar5 = ~(uVar3 / 0xf3);
      if (uVar3 % 0xf3 == 0) {
        uVar2 = 0;
        uVar5 = -(uVar3 / 0xf3);
      }
      if (uVar2 < 0x14) {
        iVar4 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                     [uVar2];
      }
      else {
        iVar4 = uVar2 + 0xd;
      }
      if ((int)uVar5 < -0xdf) {
        iVar7 = (int)_ISCIIStaticData.name[(long)(int)uVar5 + 0x3b];
      }
      else {
        iVar7 = uVar5 + 0x100;
      }
      return uVar1 | iVar4 << 8 | iVar7 << 0x10 | 0x21000000;
    }
    uVar1 = -diff - 0x40;
    uVar3 = (uVar1 & 0xffff) * 0xdb3 >> 0x10;
    uVar5 = ((uVar1 - uVar3 & 0xffff) >> 1) + uVar3 >> 7;
    iVar4 = uVar1 + uVar5 * -0xf3;
    uVar1 = -uVar5;
    uVar3 = 0;
    if ((short)iVar4 != 0) {
      uVar3 = 0xf3 - iVar4;
      uVar1 = ~uVar5;
    }
    if ((ushort)uVar3 < 0x14) {
      uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [uVar3 & 0xffff];
    }
    else {
      uVar3 = uVar3 + 0xd & 0xffff;
    }
    uVar1 = uVar1 * 0x100 + 0x5000;
  }
  else {
    if (0x2910 < diff) {
      if ((uint)diff < 0x2dd0c) {
        uVar3 = diff - 0x2911;
        uVar1 = uVar3 % 0xf3;
        if (uVar1 < 0x14) {
          uVar1 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar1];
        }
        else {
          uVar1 = uVar1 + 0xd;
        }
        uVar5 = (uVar3 / 0xf3 & 0xffff) * 0xdb3 >> 0x10;
        uVar5 = uVar3 / 0xf3 + (((uVar3 / 0xf3 - uVar5 & 0xffff) >> 1) + uVar5 >> 7) * -0xf3;
        if ((ushort)uVar5 < 0x14) {
          uVar5 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar5 & 0xffff];
        }
        else {
          uVar5 = uVar5 + 0xd & 0xffff;
        }
        return (uVar3 / 0xe6a9) * 0x10000 + 0xfb0000 | uVar1 | uVar5 << 8 | 0x3000000;
      }
      uVar3 = diff - 0x2dd0c;
      uVar1 = uVar3 % 0xf3;
      if (uVar1 < 0x14) {
        uVar1 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar1];
      }
      else {
        uVar1 = uVar1 + 0xd;
      }
      uVar5 = uVar3 / 0xf3 + (uVar3 / 0xe6a9) * -0xf3;
      if (uVar5 < 0x14) {
        iVar4 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                     [uVar5];
      }
      else {
        iVar4 = uVar5 + 0xd;
      }
      if (uVar3 < 0x120534) {
        iVar7 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                     [uVar3 / 0xe6a9];
      }
      else {
        iVar7 = uVar3 / 0xe6a9 + 0xd;
      }
      return uVar1 | iVar4 << 8 | iVar7 << 0x10 | 0xfe000000;
    }
    iVar4 = (int)(short)(diff + -0x40) / 0xf3;
    iVar7 = diff + -0x40 + iVar4 * -0xf3;
    sVar6 = (short)iVar7;
    if (sVar6 < 0x14) {
      uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [sVar6];
    }
    else {
      uVar3 = iVar7 + 0xdU & 0xffff;
    }
    uVar1 = iVar4 * 0x100 + 0xd000;
  }
  return uVar1 | uVar3 | 0x2000000;
}

Assistant:

static int32_t
packDiff(int32_t diff) {
    int32_t result, m;

    U_ASSERT(!DIFF_IS_SINGLE(diff)); /* assume we won't be called where diff==BOCU1_REACH_NEG_1=-64 */
    if(diff>=BOCU1_REACH_NEG_1) {
        /* mostly positive differences, and single-byte negative ones */
#if 0   /* single-byte case handled in macros, see below */
        if(diff<=BOCU1_REACH_POS_1) {
            /* single byte */
            return 0x01000000|(BOCU1_MIDDLE+diff);
        } else
#endif
        if(diff<=BOCU1_REACH_POS_2) {
            /* two bytes */
            diff-=BOCU1_REACH_POS_1+1;
            result=0x02000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_POS_2+diff)<<8;
        } else if(diff<=BOCU1_REACH_POS_3) {
            /* three bytes */
            diff-=BOCU1_REACH_POS_2+1;
            result=0x03000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_POS_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_POS_3+1;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that / and % would deliver quotient 0 and rest=diff.
             * Avoid division and modulo for performance.
             */
            result|=BOCU1_TRAIL_TO_BYTE(diff)<<16;

            result|=((uint32_t)BOCU1_START_POS_4)<<24;
        }
    } else {
        /* two- to four-byte negative differences */
        if(diff>=BOCU1_REACH_NEG_2) {
            /* two bytes */
            diff-=BOCU1_REACH_NEG_1;
            result=0x02000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_NEG_2+diff)<<8;
        } else if(diff>=BOCU1_REACH_NEG_3) {
            /* three bytes */
            diff-=BOCU1_REACH_NEG_2;
            result=0x03000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_NEG_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_NEG_3;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that NEGDIVMOD would deliver
             * quotient -1 and rest=diff+BOCU1_TRAIL_COUNT.
             * Avoid division and modulo for performance.
             */
            m=diff+BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<16;

            result|=BOCU1_MIN<<24;
        }
    }
    return result;
}